

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IfConversion::CanHoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  BasicBlock *this_00;
  bool bVar1;
  IRContext *pIVar2;
  anon_class_32_4_49755fc2 local_80;
  function<bool_(unsigned_int_*)> local_60;
  DefUseManager *local_40;
  DefUseManager *def_use_mgr;
  BasicBlock *inst_block;
  DominatorAnalysis *dominators_local;
  BasicBlock *target_block_local;
  Instruction *inst_local;
  IfConversion *this_local;
  
  inst_block = (BasicBlock *)dominators;
  dominators_local = (DominatorAnalysis *)target_block;
  target_block_local = (BasicBlock *)inst;
  inst_local = (Instruction *)this;
  pIVar2 = Pass::context(&this->super_Pass);
  def_use_mgr = (DefUseManager *)
                IRContext::get_instr_block(pIVar2,(Instruction *)target_block_local);
  if (def_use_mgr == (DefUseManager *)0x0) {
    this_local._7_1_ = 1;
  }
  else {
    bVar1 = DominatorAnalysisBase::Dominates
                      ((DominatorAnalysisBase *)inst_block,(BasicBlock *)def_use_mgr,
                       (BasicBlock *)dominators_local);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      bVar1 = Instruction::IsOpcodeCodeMotionSafe((Instruction *)target_block_local);
      if (bVar1) {
        pIVar2 = Pass::context(&this->super_Pass);
        local_80.def_use_mgr = IRContext::get_def_use_mgr(pIVar2);
        this_00 = target_block_local;
        local_80.target_block = (BasicBlock *)dominators_local;
        local_80.dominators = (DominatorAnalysis *)inst_block;
        local_80.this = this;
        local_40 = local_80.def_use_mgr;
        std::function<bool(unsigned_int*)>::
        function<spvtools::opt::IfConversion::CanHoistInstruction(spvtools::opt::Instruction*,spvtools::opt::BasicBlock*,spvtools::opt::DominatorAnalysis*)::__0,void>
                  ((function<bool(unsigned_int*)> *)&local_60,&local_80);
        this_local._7_1_ = Instruction::WhileEachInId((Instruction *)this_00,&local_60);
        std::function<bool_(unsigned_int_*)>::~function(&local_60);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IfConversion::CanHoistInstruction(Instruction* inst,
                                       BasicBlock* target_block,
                                       DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return true;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return true;
  }

  if (!inst->IsOpcodeCodeMotionSafe()) {
    return false;
  }

  // Check all instruction |inst| depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  return inst->WhileEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        return CanHoistInstruction(operand_inst, target_block, dominators);
      });
}